

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::parse_value<unsigned_int>
               (string *text,vector<unsigned_int,_std::allocator<unsigned_int>_> *value)

{
  istream *piVar1;
  uint v;
  string token;
  stringstream in;
  byte abStack_190 [360];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)text,_S_out|_S_in);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  while ((abStack_190[*(long *)(_in + -0x18)] & 2) == 0) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&token,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    integer_parser<unsigned_int>(&token,&v);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>(value,&v);
  }
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::stringstream::~stringstream((stringstream *)&in);
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }